

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::backend_openGL_mock::MockGLEngine::createSlicePlaneFliterRule
          (MockGLEngine *this,string *uniquePostfix)

{
  __hashtable *__h;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_198;
  string local_178;
  string local_158;
  ShaderReplacementRule local_138;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  local_b8;
  
  std::operator+(&bStack_198,"SLICE_PLANE_CULL_",uniquePostfix);
  std::__cxx11::string::string((string *)&local_158,(string *)uniquePostfix);
  backend_openGL3_glfw::generateSlicePlaneRule(&local_138,&local_158);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_true>
            (&local_b8,&bStack_198,&local_138);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->registeredShaderRules,&local_b8);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(&local_b8);
  ShaderReplacementRule::~ShaderReplacementRule(&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&bStack_198);
  std::operator+(&bStack_198,"SLICE_PLANE_VOLUMEGRID_CULL_",uniquePostfix);
  std::__cxx11::string::string((string *)&local_178,(string *)uniquePostfix);
  backend_openGL3_glfw::generateVolumeGridSlicePlaneRule(&local_138,&local_178);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_true>
            (&local_b8,&bStack_198,&local_138);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->registeredShaderRules,&local_b8);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::~pair(&local_b8);
  ShaderReplacementRule::~ShaderReplacementRule(&local_138);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&bStack_198);
  return;
}

Assistant:

void MockGLEngine::createSlicePlaneFliterRule(std::string uniquePostfix) {
  using namespace backend_openGL3_glfw;
  registeredShaderRules.insert({"SLICE_PLANE_CULL_" + uniquePostfix, generateSlicePlaneRule(uniquePostfix)});
  registeredShaderRules.insert(
      {"SLICE_PLANE_VOLUMEGRID_CULL_" + uniquePostfix, generateVolumeGridSlicePlaneRule(uniquePostfix)});
}